

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

void setseed(lua_State *L,unsigned_long *state,lua_Unsigned n1,lua_Unsigned n2)

{
  int local_2c;
  int i;
  lua_Unsigned n2_local;
  lua_Unsigned n1_local;
  unsigned_long *state_local;
  lua_State *L_local;
  
  *state = n1;
  state[1] = 0xff;
  state[2] = n2;
  state[3] = 0;
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    nextrand(state);
  }
  lua_pushinteger(L,n1);
  lua_pushinteger(L,n2);
  return;
}

Assistant:

static void setseed (lua_State *L, Rand64 *state,
                     lua_Unsigned n1, lua_Unsigned n2) {
  int i;
  state[0] = Int2I(n1);
  state[1] = Int2I(0xff);  /* avoid a zero state */
  state[2] = Int2I(n2);
  state[3] = Int2I(0);
  for (i = 0; i < 16; i++)
    nextrand(state);  /* discard initial values to "spread" seed */
  lua_pushinteger(L, l_castU2S(n1));
  lua_pushinteger(L, l_castU2S(n2));
}